

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

void __thiscall ftxui::ComponentBase::~ComponentBase(ComponentBase *this)

{
  ~ComponentBase(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

ComponentBase::~ComponentBase() {
  DetachAllChildren();
}